

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::SplitNDLayerParams::SharedCtor(SplitNDLayerParams *this)

{
  SplitNDLayerParams *this_local;
  
  memset(&this->axis_,0,0x10);
  this->_cached_size_ = 0;
  return;
}

Assistant:

void SplitNDLayerParams::SharedCtor() {
  ::memset(&axis_, 0, reinterpret_cast<char*>(&numsplits_) -
    reinterpret_cast<char*>(&axis_) + sizeof(numsplits_));
  _cached_size_ = 0;
}